

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

char * nlohmann::detail::dtoa_impl::format_buffer
                 (char *buf,int len,int decimal_exponent,int min_exp,int max_exp)

{
  int iVar1;
  int n;
  int k;
  int max_exp_local;
  int min_exp_local;
  int decimal_exponent_local;
  int len_local;
  char *buf_local;
  
  if (-1 < min_exp) {
    __assert_fail("min_exp < 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abedra[P]libvault/lib/json.hpp"
                  ,0x2e65,
                  "char *nlohmann::detail::dtoa_impl::format_buffer(char *, int, int, int, int)");
  }
  if (0 < max_exp) {
    iVar1 = len + decimal_exponent;
    if ((iVar1 < len) || (max_exp < iVar1)) {
      if ((iVar1 < 1) || (max_exp < iVar1)) {
        if ((min_exp < iVar1) && (iVar1 < 1)) {
          memmove(buf + (2 - iVar1),buf,(long)len);
          *buf = '0';
          buf[1] = '.';
          memset(buf + 2,0x30,(long)-iVar1);
          buf_local = buf + ((2 - iVar1) + len);
        }
        else {
          if (len == 1) {
            _decimal_exponent_local = buf + 1;
          }
          else {
            memmove(buf + 2,buf + 1,(long)(len + -1));
            buf[1] = '.';
            _decimal_exponent_local = buf + (len + 1);
          }
          *_decimal_exponent_local = 'e';
          buf_local = append_exponent(_decimal_exponent_local + 1,iVar1 + -1);
        }
      }
      else {
        if (len <= iVar1) {
          __assert_fail("k > n",
                        "/workspace/llm4binary/github/license_c_cmakelists/abedra[P]libvault/lib/json.hpp"
                        ,0x2e80,
                        "char *nlohmann::detail::dtoa_impl::format_buffer(char *, int, int, int, int)"
                       );
        }
        memmove(buf + (iVar1 + 1),buf + iVar1,(long)(len - iVar1));
        buf[iVar1] = '.';
        buf_local = buf + (len + 1);
      }
    }
    else {
      memset(buf + len,0x30,(long)(iVar1 - len));
      buf[iVar1] = '.';
      buf[iVar1 + 1] = '0';
      buf_local = buf + (iVar1 + 2);
    }
    return buf_local;
  }
  __assert_fail("max_exp > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/abedra[P]libvault/lib/json.hpp",
                0x2e66,
                "char *nlohmann::detail::dtoa_impl::format_buffer(char *, int, int, int, int)");
}

Assistant:

inline char* format_buffer(char* buf, int len, int decimal_exponent,
                           int min_exp, int max_exp)
{
    assert(min_exp < 0);
    assert(max_exp > 0);

    const int k = len;
    const int n = len + decimal_exponent;

    // v = buf * 10^(n-k)
    // k is the length of the buffer (number of decimal digits)
    // n is the position of the decimal point relative to the start of the buffer.

    if (k <= n and n <= max_exp)
    {
        // digits[000]
        // len <= max_exp + 2

        std::memset(buf + k, '0', static_cast<size_t>(n - k));
        // Make it look like a floating-point number (#362, #378)
        buf[n + 0] = '.';
        buf[n + 1] = '0';
        return buf + (n + 2);
    }

    if (0 < n and n <= max_exp)
    {
        // dig.its
        // len <= max_digits10 + 1

        assert(k > n);

        std::memmove(buf + (n + 1), buf + n, static_cast<size_t>(k - n));
        buf[n] = '.';
        return buf + (k + 1);
    }

    if (min_exp < n and n <= 0)
    {
        // 0.[000]digits
        // len <= 2 + (-min_exp - 1) + max_digits10

        std::memmove(buf + (2 + -n), buf, static_cast<size_t>(k));
        buf[0] = '0';
        buf[1] = '.';
        std::memset(buf + 2, '0', static_cast<size_t>(-n));
        return buf + (2 + (-n) + k);
    }

    if (k == 1)
    {
        // dE+123
        // len <= 1 + 5

        buf += 1;
    }
    else
    {
        // d.igitsE+123
        // len <= max_digits10 + 1 + 5

        std::memmove(buf + 2, buf + 1, static_cast<size_t>(k - 1));
        buf[1] = '.';
        buf += 1 + k;
    }

    *buf++ = 'e';
    return append_exponent(buf, n - 1);
}